

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

size_t x86_Convert(_7zip *zip,uint8_t *data,size_t size)

{
  uint32_t uVar1;
  char cVar2;
  uint uVar3;
  int b_index;
  uint8_t b_1;
  uint32_t dest;
  uint32_t src;
  uchar b;
  uint8_t *limit;
  uint8_t *p;
  uint32_t prevMask;
  uint32_t ip;
  size_t prevPosT;
  size_t bufferPos;
  size_t size_local;
  uint8_t *data_local;
  _7zip *zip_local;
  size_t local_8;
  
  if (size < 5) {
    local_8 = 0;
  }
  else {
    bufferPos = 0;
    prevMask = zip->bcj_prevMask;
    uVar1 = zip->bcj_ip;
    prevPosT = zip->bcj_prevPosT;
    while( true ) {
      for (p = data + bufferPos; (p < data + (size - 4) && ((*p & 0xfe) != 0xe8)); p = p + 1) {
      }
      local_8 = (long)p - (long)data;
      if (data + (size - 4) <= p) break;
      if (local_8 - prevPosT < 4) {
        uVar3 = prevMask << ((char)(local_8 - prevPosT) - 1U & 0x1f);
        prevMask = uVar3 & 7;
        if ((prevMask == 0) ||
           ((("\x01\x01\x01"[prevMask] != '\0' && (p[(int)(4 - (uint)""[prevMask])] != '\0')) &&
            (p[(int)(4 - (uint)""[prevMask])] != 0xff)))) goto LAB_0013bf07;
        prevMask = (uVar3 & 3) << 1 | 1;
        bufferPos = local_8 + 1;
        prevPosT = local_8;
      }
      else {
        prevMask = 0;
LAB_0013bf07:
        if ((p[4] == '\0') || (p[4] == 0xff)) {
          src = (uint)p[4] << 0x18 | (uint)p[3] << 0x10 | (uint)p[2] << 8 | (uint)p[1];
          while (uVar3 = src - (uVar1 + (int)local_8), prevMask != 0) {
            cVar2 = (char)(uVar3 >> (""[prevMask] * -8 + 0x18 & 0x1f));
            if ((cVar2 != '\0') && (cVar2 != -1)) break;
            src = uVar3 ^ (1 << (""[prevMask] * -8 + 0x20 & 0x1f)) - 1U;
          }
          p[4] = ((byte)(uVar3 >> 0x18) & 1) - 1 ^ 0xff;
          p[3] = (uint8_t)(uVar3 >> 0x10);
          p[2] = (uint8_t)(uVar3 >> 8);
          p[1] = (uint8_t)uVar3;
          bufferPos = local_8 + 5;
          prevPosT = local_8;
        }
        else {
          prevMask = (prevMask & 3) << 1 | 1;
          bufferPos = local_8 + 1;
          prevPosT = local_8;
        }
      }
    }
    zip->bcj_prevPosT = prevPosT;
    zip->bcj_prevMask = prevMask;
    zip->bcj_ip = (int)local_8 + zip->bcj_ip;
  }
  return local_8;
}

Assistant:

static size_t
x86_Convert(struct _7zip *zip, uint8_t *data, size_t size)
{
	static const uint8_t kMaskToAllowedStatus[8] = {1, 1, 1, 0, 1, 0, 0, 0};
	static const uint8_t kMaskToBitNumber[8] = {0, 1, 2, 2, 3, 3, 3, 3};
	size_t bufferPos, prevPosT;
	uint32_t ip, prevMask;

	if (size < 5)
		return 0;

	bufferPos = 0;
	prevPosT = zip->bcj_prevPosT;
	prevMask = zip->bcj_prevMask;
	ip = zip->bcj_ip;

	for (;;) {
		uint8_t *p = data + bufferPos;
		uint8_t *limit = data + size - 4;

		for (; p < limit; p++)
			if ((*p & 0xFE) == 0xE8)
				break;
		bufferPos = (size_t)(p - data);
		if (p >= limit)
			break;
		prevPosT = bufferPos - prevPosT;
		if (prevPosT > 3)
			prevMask = 0;
		else {
			prevMask = (prevMask << ((int)prevPosT - 1)) & 0x7;
			if (prevMask != 0) {
				unsigned char b =
					p[4 - kMaskToBitNumber[prevMask]];
				if (!kMaskToAllowedStatus[prevMask] ||
				    Test86MSByte(b)) {
					prevPosT = bufferPos;
					prevMask = ((prevMask << 1) & 0x7) | 1;
					bufferPos++;
					continue;
				}
			}
		}
		prevPosT = bufferPos;

		if (Test86MSByte(p[4])) {
			uint32_t src = ((uint32_t)p[4] << 24) |
				((uint32_t)p[3] << 16) | ((uint32_t)p[2] << 8) |
				((uint32_t)p[1]);
			uint32_t dest;
			for (;;) {
				uint8_t b;
				int b_index;

				dest = src - (ip + (uint32_t)bufferPos);
				if (prevMask == 0)
					break;
				b_index = kMaskToBitNumber[prevMask] * 8;
				b = (uint8_t)(dest >> (24 - b_index));
				if (!Test86MSByte(b))
					break;
				src = dest ^ ((1 << (32 - b_index)) - 1);
			}
			p[4] = (uint8_t)(~(((dest >> 24) & 1) - 1));
			p[3] = (uint8_t)(dest >> 16);
			p[2] = (uint8_t)(dest >> 8);
			p[1] = (uint8_t)dest;
			bufferPos += 5;
		} else {
			prevMask = ((prevMask << 1) & 0x7) | 1;
			bufferPos++;
		}
	}
	zip->bcj_prevPosT = prevPosT;
	zip->bcj_prevMask = prevMask;
	zip->bcj_ip += (uint32_t)bufferPos;
	return (bufferPos);
}